

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintBytesInObjectTo(uchar *obj_bytes,size_t count,ostream *os)

{
  ostream *poVar1;
  size_t start;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-byte object <",0xe);
  if (count < 0x84) {
    start = 0;
  }
  else {
    anon_unknown_45::PrintByteSegmentInObjectTo(obj_bytes,0,0x40,os);
    std::__ostream_insert<char,std::char_traits<char>>(os," ... ",5);
    start = count - 0x3f & 0xfffffffffffffffe;
    count = count - start;
  }
  anon_unknown_45::PrintByteSegmentInObjectTo(obj_bytes,start,count,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,">",1);
  return;
}

Assistant:

void PrintBytesInObjectTo(const unsigned char* obj_bytes, size_t count,
                          ostream* os) {
  PrintBytesInObjectToImpl(obj_bytes, count, os);
}